

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O3

int findvidx(rnndb *db,rnnenum *en,char *name)

{
  int iVar1;
  rnnvalue **pprVar2;
  int iVar3;
  long lVar4;
  
  iVar1 = en->valsnum;
  if (0 < (long)iVar1) {
    pprVar2 = en->vals;
    lVar4 = 0;
    do {
      iVar3 = strcmp(pprVar2[lVar4]->name,name);
      if (iVar3 == 0) goto LAB_00105f49;
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  fprintf(_stderr,"Cannot find variant %s in enum %s!\n",name,en->name);
  db->estatus = 1;
  lVar4 = 0xffffffff;
LAB_00105f49:
  return (int)lVar4;
}

Assistant:

static int findvidx (struct rnndb *db, struct rnnenum *en, char *name) {
	int i;
	for (i = 0; i < en->valsnum; i++)
		if (!strcmp(en->vals[i]->name, name))
			return i;
	fprintf (stderr, "Cannot find variant %s in enum %s!\n", name, en->name);
	db->estatus = 1;
	return -1;
}